

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInt.h
# Opt level: O0

abctime Pdr_ManTimeLimit(Pdr_Man_t *p)

{
  Pdr_Man_t *p_local;
  
  if (p->timeToStop == 0) {
    p_local = (Pdr_Man_t *)p->timeToStopOne;
  }
  else if (p->timeToStopOne == 0) {
    p_local = (Pdr_Man_t *)p->timeToStop;
  }
  else if (p->timeToStop < p->timeToStopOne) {
    p_local = (Pdr_Man_t *)p->timeToStop;
  }
  else {
    p_local = (Pdr_Man_t *)p->timeToStopOne;
  }
  return (abctime)p_local;
}

Assistant:

static inline abctime      Pdr_ManTimeLimit( Pdr_Man_t * p )
{
    if ( p->timeToStop == 0 )
        return p->timeToStopOne;
    if ( p->timeToStopOne == 0 )
        return p->timeToStop;
    if ( p->timeToStop < p->timeToStopOne )
        return p->timeToStop;
    return p->timeToStopOne;
}